

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bucketaccum.hpp
# Opt level: O2

void __thiscall mp::BucketAccumulator<mp::EExpr>::Add(BucketAccumulator<mp::EExpr> *this,EExpr *ee)

{
  LinTerms local_1d0;
  QuadTerms local_158;
  
  this->ct_ = (ee->super_QuadraticExpr).constant_term_ + this->ct_;
  LinTerms::LinTerms(&local_1d0,(LinTerms *)ee);
  BucketAccum1Type<mp::LinTerms>::Add(&this->ba_l_,&local_1d0);
  LinTerms::~LinTerms(&local_1d0);
  QuadTerms::QuadTerms(&local_158,&(ee->super_QuadraticExpr).super_QuadAndLinTerms.super_QuadTerms);
  BucketAccum1Type<mp::QuadTerms>::Add(&this->ba_q_,&local_158);
  QuadTerms::~QuadTerms(&local_158);
  return;
}

Assistant:

void BucketAccumulator<EExprLike>::Add(EExprLike ee) {
  ct_ += ee.constant_term();
  ba_l_.Add(std::move(ee.GetBody().GetLinTerms()));
  ba_q_.Add(std::move(ee.GetBody().GetQPTerms()));
}